

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall
QGraphicsItem::collidesWithItem(QGraphicsItem *this,QGraphicsItem *other,ItemSelectionMode mode)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QGraphicsItemPrivate *pQVar5;
  uint in_EDX;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  bool res;
  QGraphicsItem *otherClosestClipper;
  QGraphicsItem *closestClipper;
  bool otherClips;
  bool clips;
  QPainterPath otherShape;
  GraphicsItemFlag in_stack_ffffffffffffff5c;
  QGraphicsItem *in_stack_ffffffffffffff60;
  bool local_91;
  QGraphicsItem *in_stack_ffffffffffffff70;
  uint7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QGraphicsItem *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QGraphicsItem *local_68;
  QGraphicsItem *local_60;
  bool local_39;
  QPainterPath local_38 [8];
  undefined1 *local_30;
  QPainterPath local_28 [8];
  QPainterPath local_20 [8];
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_18;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_14;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_10;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == in_RDI) {
    local_39 = true;
  }
  else if (in_RSI == (QGraphicsItem *)0x0) {
    local_39 = false;
  }
  else {
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->d_ptr);
    uVar1 = *(ulong *)&pQVar5->field_0x160;
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (((uVar1 & 0x20000) != 0) || ((*(ulong *)&pQVar5->field_0x160 & 0x20000) != 0)) {
      bVar2 = isAncestorOf((QGraphicsItem *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff80 = in_RDI;
      local_60 = in_RDI;
      if (!bVar2) {
        local_60 = parentItem((QGraphicsItem *)0x980e7c);
        in_stack_ffffffffffffff80 = local_60;
      }
      while( true ) {
        in_stack_ffffffffffffff7f = false;
        if (local_60 != (QGraphicsItem *)0x0) {
          local_10.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
               (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)flags(in_stack_ffffffffffffff60);
          local_c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
               (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
               QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                         ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c);
          in_stack_ffffffffffffff7f =
               QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                         ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_c);
        }
        if ((bool)in_stack_ffffffffffffff7f == false) break;
        local_60 = parentItem((QGraphicsItem *)0x980ee8);
      }
      bVar2 = isAncestorOf((QGraphicsItem *)(ulong)in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff70 = in_RSI;
      local_68 = in_RSI;
      if (!bVar2) {
        local_68 = parentItem((QGraphicsItem *)0x980f1a);
        in_stack_ffffffffffffff70 = local_68;
      }
      while( true ) {
        local_91 = false;
        if (local_68 != (QGraphicsItem *)0x0) {
          local_18.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
               (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)flags(in_stack_ffffffffffffff60);
          local_14.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
               (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
               QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                         ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c);
          local_91 = QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                               ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_14);
        }
        if (local_91 == false) break;
        local_68 = parentItem((QGraphicsItem *)0x980f86);
      }
      if (local_60 == local_68) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RDI->d_ptr);
        *(ulong *)&pQVar5->field_0x160 =
             *(ulong *)&pQVar5->field_0x160 & 0xfffffffff7ffffff | 0x8000000;
        (*in_RSI->_vptr_QGraphicsItem[4])(local_28);
        mapFromItem(in_stack_ffffffffffffff80,
                    (QGraphicsItem *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    (QPainterPath *)in_stack_ffffffffffffff70);
        iVar4 = (*in_RDI->_vptr_QGraphicsItem[7])(in_RDI,local_20,(ulong)in_EDX);
        QPainterPath::~QPainterPath(local_20);
        QPainterPath::~QPainterPath(local_28);
        bVar3 = (byte)iVar4 & 1;
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RDI->d_ptr);
        *(ulong *)&pQVar5->field_0x160 = *(ulong *)&pQVar5->field_0x160 & 0xfffffffff7ffffff;
        local_39 = (bool)(bVar3 & 1);
        goto LAB_009810fe;
      }
    }
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    bVar2 = isClipped(in_stack_ffffffffffffff60);
    if (bVar2) {
      clipPath((QGraphicsItem *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    else {
      (*in_RSI->_vptr_QGraphicsItem[4])(&local_30);
    }
    mapFromItem(in_stack_ffffffffffffff80,
                (QGraphicsItem *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                (QPainterPath *)in_stack_ffffffffffffff70);
    iVar4 = (*in_RDI->_vptr_QGraphicsItem[7])(in_RDI,local_38,(ulong)in_EDX);
    local_39 = (bool)((byte)iVar4 & 1);
    QPainterPath::~QPainterPath(local_38);
    QPainterPath::~QPainterPath((QPainterPath *)&local_30);
  }
LAB_009810fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QGraphicsItem::collidesWithItem(const QGraphicsItem *other, Qt::ItemSelectionMode mode) const
{
    if (other == this)
        return true;
    if (!other)
        return false;
    // The items share the same clip if their closest clipper is the same, or
    // if one clips the other.
    bool clips = (d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    bool otherClips = (other->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    if (clips || otherClips) {
        const QGraphicsItem *closestClipper = isAncestorOf(other) ? this : parentItem();
        while (closestClipper && !(closestClipper->flags() & ItemClipsChildrenToShape))
            closestClipper = closestClipper->parentItem();
        const QGraphicsItem *otherClosestClipper = other->isAncestorOf(this) ? other : other->parentItem();
        while (otherClosestClipper && !(otherClosestClipper->flags() & ItemClipsChildrenToShape))
            otherClosestClipper = otherClosestClipper->parentItem();
        if (closestClipper == otherClosestClipper) {
            d_ptr->localCollisionHack = 1;
            bool res = collidesWithPath(mapFromItem(other, other->shape()), mode);
            d_ptr->localCollisionHack = 0;
            return res;
        }
    }

    QPainterPath otherShape = other->isClipped() ? other->clipPath() : other->shape();
    return collidesWithPath(mapFromItem(other, otherShape), mode);
}